

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.hpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
ranges::detail::to_container::fn<ranges::detail::from_range<std::vector>>::
impl<std::vector<double,std::allocator<double>>,ranges::basic_iterator<ranges::concat_view<ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::ref_view<std::vector<double,std::allocator<double>>>>::cursor<true>>,ranges::concat_view<ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::ref_view<std::vector<double,std::allocator<double>>>>>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          fn<ranges::detail::from_range<std::vector>> *this)

{
  vector<double,_std::allocator<double>_> local_58;
  facade_iterator_t<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>_>
  local_40;
  basic_iterator<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>_>
  local_28;
  
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve
            (&local_58,
             ((*(long **)(this + 8))[1] - **(long **)(this + 8) >> 3) +
             ((*(long **)(this + 0x10))[1] - **(long **)(this + 0x10) >> 3));
  view_facade<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)-1>
  ::
  begin<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_true,_0>
            (&local_40,
             (view_facade<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)_1>
              *)this);
  local_28.
  super_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
  .
  super_readable_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void>
  .
  super_mixin_base_t<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
  .
  super_box<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void,_(ranges::detail::box_compress)0>
  .value.its_.
  super_variant_data<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>
  .field_0 = *(anon_union_8_2_3194c211_for_type_0 *)(*(long *)(this + 8) + 8);
  local_28.
  super_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
  .
  super_readable_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void>
  .
  super_mixin_base_t<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
  .
  super_box<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void,_(ranges::detail::box_compress)0>
  .value.its_.index_ = 1;
  local_28.
  super_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
  .
  super_readable_iterator_associated_types_base<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void>
  .
  super_mixin_base_t<ranges::concat_view<ranges::ref_view<std::vector<double>_>,_ranges::ref_view<std::vector<double>_>_>::cursor<true>_>
  .
  super_box<ranges::concat_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<true>,_void,_(ranges::detail::box_compress)0>
  .value.rng_ = (concat_view_t *)this;
  std::vector<double,std::allocator<double>>::
  assign<ranges::basic_iterator<ranges::concat_view<ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::ref_view<std::vector<double,std::allocator<double>>>>::cursor<true>>,void>
            ((vector<double,std::allocator<double>> *)&local_58,&local_40,&local_28);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  return __return_storage_ptr__;
}

Assistant:

static auto impl(Rng && rng, std::true_type)
            {
                Cont c;
                auto const rng_size = ranges::size(rng);
                using size_type = decltype(c.max_size());
                using C = common_type_t<range_size_t<Rng>, size_type>;
                RANGES_EXPECT(static_cast<C>(rng_size) <= static_cast<C>(c.max_size()));
                c.reserve(static_cast<size_type>(rng_size));
                c.assign(I{ranges::begin(rng)}, I{ranges::end(rng)});
                return c;
            }